

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_cmp.cc
# Opt level: O2

ulong X509_NAME_hash(X509_NAME *x)

{
  int iVar1;
  uint uVar2;
  uint8_t md [20];
  uint local_28 [6];
  
  iVar1 = i2d_X509_NAME(x,(uchar **)0x0);
  uVar2 = 0;
  if (-1 < iVar1) {
    SHA1(x->canon_enc,(long)x->canon_enclen,(uchar *)local_28);
    uVar2 = local_28[0];
  }
  return (ulong)uVar2;
}

Assistant:

uint32_t X509_NAME_hash(X509_NAME *x) {
  // Make sure the X509_NAME structure contains a valid cached encoding.
  if (i2d_X509_NAME(x, NULL) < 0) {
    return 0;
  }

  uint8_t md[SHA_DIGEST_LENGTH];
  SHA1(x->canon_enc, x->canon_enclen, md);
  return CRYPTO_load_u32_le(md);
}